

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

FilePath * __thiscall
testing::internal::FilePath::RemoveDirectoryName(FilePath *__return_storage_ptr__,FilePath *this)

{
  char *pcVar1;
  allocator local_41;
  string local_40;
  char *local_20;
  char *last_sep;
  FilePath *this_local;
  
  last_sep = (char *)this;
  this_local = __return_storage_ptr__;
  local_20 = FindLastPathSeparator(this);
  if (local_20 == (char *)0x0) {
    FilePath(__return_storage_ptr__,this);
  }
  else {
    pcVar1 = local_20 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
    FilePath(__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveDirectoryName() const {
  const char* const last_sep = FindLastPathSeparator();
  return last_sep ? FilePath(last_sep + 1) : *this;
}